

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexWriter.cpp
# Opt level: O0

bool Ptex::v2_4::PtexWriter::applyEdits(char *path,String *error)

{
  int iVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined4 extraout_var;
  ulong uVar4;
  PtexWriter *pPVar5;
  undefined8 in_RSI;
  char *in_RDI;
  bool bVar6;
  bool in_stack_00000023;
  int in_stack_00000024;
  DataType in_stack_00000028;
  MeshType in_stack_0000002c;
  PtexTexture *in_stack_00000030;
  char *in_stack_00000038;
  PtexMainWriter *in_stack_00000040;
  int in_stack_00000050;
  int in_stack_00000058;
  PtexPtr<Ptex::v2_4::PtexWriter> w;
  PtexTexture *tex;
  undefined4 in_stack_ffffffffffffff64;
  PtexPtr<Ptex::v2_4::PtexWriter> local_30;
  long *local_28;
  undefined8 local_20;
  byte local_9;
  
  local_20 = in_RSI;
  iVar1 = PtexTexture::open(in_RDI,(int)in_RSI,0);
  local_28 = (long *)CONCAT44(extraout_var,iVar1);
  if (local_28 == (long *)0x0) {
    local_9 = 0;
  }
  else {
    uVar4 = (**(code **)(*local_28 + 0x68))();
    if ((uVar4 & 1) != 0) {
      pPVar5 = (PtexWriter *)operator_new(0x290);
      (**(code **)(*local_28 + 0x28))();
      (**(code **)(*local_28 + 0x30))();
      (**(code **)(*local_28 + 0x58))();
      (**(code **)(*local_28 + 0x50))();
      uVar2 = (**(code **)(*local_28 + 0x60))();
      (**(code **)(*local_28 + 0x70))();
      PtexMainWriter::PtexMainWriter
                (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_0000002c,
                 in_stack_00000028,in_stack_00000024,in_stack_00000050,in_stack_00000058,
                 in_stack_00000023);
      PtexPtr<Ptex::v2_4::PtexWriter>::PtexPtr(&local_30,pPVar5);
      pPVar5 = PtexPtr<Ptex::v2_4::PtexWriter>::operator->(&local_30);
      uVar3 = (*pPVar5->_vptr_PtexWriter[0xe])(pPVar5,local_20);
      bVar6 = (uVar3 & 1) == 0;
      if (bVar6) {
        local_9 = 0;
      }
      PtexPtr<Ptex::v2_4::PtexWriter>::~PtexPtr
                ((PtexPtr<Ptex::v2_4::PtexWriter> *)CONCAT44(in_stack_ffffffffffffff64,uVar2));
      if (bVar6) goto LAB_001250d4;
    }
    local_9 = 1;
  }
LAB_001250d4:
  return (bool)(local_9 & 1);
}

Assistant:

bool PtexWriter::applyEdits(const char* path, Ptex::String& error)
{
    // open reader for existing file
    PtexTexture* tex = PtexTexture::open(path, error);
    if (!tex) return 0;

    // see if we have any edits to apply
    if (tex->hasEdits()) {
        // create non-incremental writer
        PtexPtr<PtexWriter> w(new PtexMainWriter(path, tex, tex->meshType(), tex->dataType(),
                                                 tex->numChannels(), tex->alphaChannel(), tex->numFaces(),
                                                 tex->hasMipMaps()));
        // close to rebuild file
        if (!w->close(error)) return 0;
    }
    return 1;
}